

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

lyd_attr * lyd_insert_attr(lyd_node *parent,lys_module *mod,char *name,char *value)

{
  ly_ctx *ctx_00;
  int iVar1;
  char *pcVar2;
  char *name_00;
  lyd_node *plVar3;
  undefined8 *puVar4;
  lys_type *plVar5;
  int local_6c;
  int local_64;
  int i;
  int pos;
  char *aux;
  char *p;
  lys_module *module;
  ly_ctx *ctx;
  lyd_attr *iter;
  lyd_attr *a;
  char *value_local;
  char *name_local;
  lys_module *mod_local;
  lyd_node *parent_local;
  
  if (((parent == (lyd_node *)0x0) || (name == (char *)0x0)) || (value == (char *)0x0)) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_insert_attr");
    return (lyd_attr *)0x0;
  }
  ctx_00 = parent->schema->module->ctx;
  pcVar2 = strchr(name,0x3a);
  if (pcVar2 == (char *)0x0) {
    p = (char *)mod;
    value_local = name;
    if (mod == (lys_module *)0x0) {
      iVar1 = strcmp(name,"type");
      if (((iVar1 == 0) || (iVar1 = strcmp(name,"select"), iVar1 == 0)) &&
         (iVar1 = strcmp(parent->schema->name,"filter"), iVar1 == 0)) {
        p = (char *)ly_ctx_get_module(ctx_00,"ietf-netconf",(char *)0x0,1);
        if ((lys_module *)p == (lys_module *)0x0) {
          ly_log(ctx_00,LY_LLERR,LY_EINVAL,
                 "Attribute prefix does not match any implemented schema in the context.");
          return (lyd_attr *)0x0;
        }
      }
      else {
        p = (char *)lyd_node_module(parent);
      }
    }
  }
  else {
    name_00 = strndup(name,(long)pcVar2 - (long)name);
    if (name_00 == (char *)0x0) {
      ly_log(ctx_00,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyd_insert_attr");
      return (lyd_attr *)0x0;
    }
    p = (char *)ly_ctx_get_module(ctx_00,name_00,(char *)0x0,1);
    free(name_00);
    value_local = pcVar2 + 1;
    if ((lys_module *)p == (lys_module *)0x0) {
      ly_log(ctx_00,LY_LLERR,LY_EINVAL,
             "Attribute prefix does not match any implemented schema in the context.");
      return (lyd_attr *)0x0;
    }
  }
  local_64 = -1;
  while( true ) {
    if (local_64 + 1U < (uint)(byte)p[0x50]) {
      local_6c = lys_ext_instance_presence
                           ((*(ctx_00->models).list)->extensions,
                            (lys_ext_instance **)(*(long *)(p + 0xa0) + (long)(local_64 + 1) * 8),
                            p[0x50] - ((char)local_64 + '\x01'));
      if (local_6c == -1) {
        local_6c = -1;
      }
      else {
        local_6c = local_64 + 1 + local_6c;
      }
      local_64 = local_6c;
    }
    else {
      local_64 = -1;
    }
    if (local_64 == -1) break;
    iVar1 = ly_strequal_(*(char **)(*(long *)(*(long *)(p + 0xa0) + (long)local_64 * 8) + 0x10),
                         value_local);
    if (iVar1 != 0) {
      parent_local = (lyd_node *)calloc(1,0x38);
      if (parent_local == (lyd_node *)0x0) {
        ly_log(ctx_00,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyd_insert_attr");
        parent_local = (lyd_node *)0x0;
      }
      else {
        parent_local->schema = (lys_node *)parent;
        *(lyd_attr **)&parent_local->validity = (lyd_attr *)0x0;
        parent_local->attr =
             (lyd_attr *)*(lys_ext_instance_complex **)(*(long *)(p + 0xa0) + (long)local_64 * 8);
        plVar3 = (lyd_node *)lydict_insert(ctx_00,value_local,0);
        parent_local->next = plVar3;
        plVar3 = (lyd_node *)lydict_insert(ctx_00,value,0);
        parent_local->prev = plVar3;
        puVar4 = (undefined8 *)
                 lys_ext_complex_get_substmt
                           (LY_STMT_TYPE,(lys_ext_instance_complex *)parent_local->attr,
                            (lyext_substmt **)0x0);
        plVar5 = lyp_parse_value((lys_type *)*puVar4,(char **)&parent_local->prev,(lyxml_elem *)0x0,
                                 (lyd_node_leaf_list *)0x0,(lyd_attr *)parent_local,
                                 (lys_module *)0x0,1,0,0);
        if (plVar5 == (lys_type *)0x0) {
          lyd_free_attr(ctx_00,(lyd_node *)0x0,(lyd_attr *)parent_local,0);
          parent_local = (lyd_node *)0x0;
        }
        else if (parent->attr == (lyd_attr *)0x0) {
          parent->attr = (lyd_attr *)parent_local;
        }
        else {
          for (ctx = (ly_ctx *)parent->attr; (ctx->dict).lock.__align != 0;
              ctx = (ly_ctx *)(ctx->dict).lock.__align) {
          }
          *(lyd_node **)&(ctx->dict).lock = parent_local;
        }
      }
      return (lyd_attr *)parent_local;
    }
  }
  ly_log(ctx_00,LY_LLERR,LY_EINVAL,"Attribute does not match any annotation instance definition.");
  return (lyd_attr *)0x0;
}

Assistant:

lyd_attr *
lyd_insert_attr(struct lyd_node *parent, const struct lys_module *mod, const char *name, const char *value)
{
    struct lyd_attr *a, *iter;
    struct ly_ctx *ctx;
    const struct lys_module *module;
    const char *p;
    char *aux;
    int pos, i;

    if (!parent || !name || !value) {
        LOGARG;
        return NULL;
    }
    ctx = parent->schema->module->ctx;

    if ((p = strchr(name, ':'))) {
        /* search for the namespace */
        aux = strndup(name, p - name);
        if (!aux) {
            LOGMEM(ctx);
            return NULL;
        }
        module = ly_ctx_get_module(ctx, aux, NULL, 1);
        free(aux);
        name = p + 1;

        if (!module) {
            /* module not found */
            LOGERR(ctx, LY_EINVAL, "Attribute prefix does not match any implemented schema in the context.");
            return NULL;
        }
    } else if (mod) {
        module = mod;
    } else if (!mod && (!strcmp(name, "type") || !strcmp(name, "select")) && !strcmp(parent->schema->name, "filter")) {
        /* special case of inserting unqualified filter attributes "type" and "select" */
        module = ly_ctx_get_module(ctx, "ietf-netconf", NULL, 1);
        if (!module) {
            LOGERR(ctx, LY_EINVAL, "Attribute prefix does not match any implemented schema in the context.");
            return NULL;
        }
    } else {
        /* no prefix -> module is the same as for the parent */
        module = lyd_node_module(parent);
    }

    pos = -1;
    do {
        if ((unsigned int)(pos + 1) < module->ext_size) {
            i = lys_ext_instance_presence(&ctx->models.list[0]->extensions[0],
                                          &module->ext[pos + 1], module->ext_size - (pos + 1));
            pos = (i == -1) ? -1 : pos + 1 + i;
        } else {
            pos = -1;
        }
        if (pos == -1) {
            LOGERR(ctx, LY_EINVAL, "Attribute does not match any annotation instance definition.");
            return NULL;
        }
    } while (!ly_strequal(module->ext[pos]->arg_value, name, 0));

    a = calloc(1, sizeof *a);
    LY_CHECK_ERR_RETURN(!a, LOGMEM(ctx), NULL);
    a->parent = parent;
    a->next = NULL;
    a->annotation = (struct lys_ext_instance_complex *)module->ext[pos];
    a->name = lydict_insert(ctx, name, 0);
    a->value_str = lydict_insert(ctx, value, 0);
    if (!lyp_parse_value(*((struct lys_type **)lys_ext_complex_get_substmt(LY_STMT_TYPE, a->annotation, NULL)),
                         &a->value_str, NULL, NULL, a, NULL, 1, 0, 0)) {
        lyd_free_attr(ctx, NULL, a, 0);
        return NULL;
    }

    if (!parent->attr) {
        parent->attr = a;
    } else {
        for (iter = parent->attr; iter->next; iter = iter->next);
        iter->next = a;
    }

    return a;
}